

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

int __thiscall
program_options::command_line_parser::get_canonical_option_prefix(command_line_parser *this)

{
  style_t sVar1;
  int iVar2;
  
  sVar1 = this->m_style;
  iVar2 = 1;
  if (((sVar1 & allow_long) == 0) && (iVar2 = 0x1000, (sVar1 >> 0xc & 1) == 0)) {
    iVar2 = 4;
    if ((~sVar1 & 6) != 0) {
      iVar2 = (uint)((~sVar1 & 10) == 0) << 3;
    }
  }
  return iVar2;
}

Assistant:

int command_line_parser::get_canonical_option_prefix() const
{
    if (m_style & command_line_style::allow_long)
        return command_line_style::allow_long;

    if (m_style & command_line_style::allow_long_disguise)
        return command_line_style::allow_long_disguise;

    if ((m_style & command_line_style::allow_short) && (m_style & command_line_style::allow_dash_for_short))
        return command_line_style::allow_dash_for_short;

    if ((m_style & command_line_style::allow_short) && (m_style & command_line_style::allow_slash_for_short))
        return command_line_style::allow_slash_for_short;

    return 0;
}